

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastAdderCLA(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int fSign,int CarryIn)

{
  int iVar1;
  int *pAdd0_00;
  int *pAdd1_00;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t __nmemb;
  
  iVar1 = Abc_Base2Log(nBits);
  iVar1 = 1 << ((byte)iVar1 & 0x1f);
  __nmemb = (size_t)iVar1;
  pAdd0_00 = (int *)calloc(__nmemb,4);
  pAdd1_00 = (int *)calloc(__nmemb,4);
  uVar2 = 0;
  uVar5 = 0;
  if (0 < nBits) {
    uVar5 = (ulong)(uint)nBits;
  }
  for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    pAdd0_00[uVar2] = pAdd0[uVar2];
    pAdd1_00[uVar2] = pAdd1[uVar2];
  }
  for (uVar2 = uVar5; (long)uVar2 < (long)__nmemb; uVar2 = uVar2 + 1) {
    if (fSign == 0) {
      iVar3 = 0;
      iVar4 = 0;
    }
    else {
      iVar3 = pAdd0[(long)nBits + -1];
      iVar4 = pAdd1[(long)nBits + -1];
    }
    pAdd0_00[uVar2] = iVar3;
    pAdd1_00[uVar2] = iVar4;
  }
  Wlc_BlastAdderCLA_int(pNew,pAdd0_00,pAdd1_00,iVar1,CarryIn);
  for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    pAdd0[uVar2] = pAdd0_00[uVar2];
  }
  free(pAdd0_00);
  free(pAdd1_00);
  return;
}

Assistant:

void Wlc_BlastAdderCLA( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int fSign, int CarryIn ) // result is in pAdd0
{
    int i, Log2 = Abc_Base2Log(nBits);
    int * pAdd0n = ABC_CALLOC( int, 1<<Log2 );
    int * pAdd1n = ABC_CALLOC( int, 1<<Log2 );
    for ( i = 0; i < nBits; i++ )
    {
        pAdd0n[i] = pAdd0[i];
        pAdd1n[i] = pAdd1[i];
    }
    for ( ; i < (1<<Log2); i++ )
    {
        pAdd0n[i] = fSign ? pAdd0[nBits-1] : 0;
        pAdd1n[i] = fSign ? pAdd1[nBits-1] : 0;
    }
    Wlc_BlastAdderCLA_int( pNew, pAdd0n, pAdd1n, 1<<Log2, CarryIn );
    for ( i = 0; i < nBits; i++ )
        pAdd0[i] = pAdd0n[i];
    ABC_FREE(pAdd0n);
    ABC_FREE(pAdd1n);
}